

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O3

bool __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
k_relevant(LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          TreeIndexLGM *t1,TreeIndexLGM *t2,int x,int y,int k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = (t1->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[x];
  iVar5 = (t1->super_PostLToDepth).postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[x];
  iVar2 = (t2->super_PostLToDepth).postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[y];
  iVar4 = (((t1->super_Constants).tree_size_ + y) - (iVar5 + x + (t2->super_Constants).tree_size_))
          + iVar2;
  iVar3 = -iVar4;
  if (0 < iVar4) {
    iVar3 = iVar4;
  }
  iVar5 = iVar5 - iVar2;
  iVar2 = -iVar5;
  if (0 < iVar5) {
    iVar2 = iVar5;
  }
  iVar5 = (t2->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[y];
  iVar6 = iVar1 - iVar5;
  iVar4 = -iVar6;
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  iVar5 = (x - (iVar1 + y)) + iVar5;
  iVar1 = -iVar5;
  if (0 < iVar5) {
    iVar1 = iVar5;
  }
  return iVar4 + iVar2 + iVar1 + iVar3 <= k;
}

Assistant:

bool LGMTreeIndex<CostModel, TreeIndex>::k_relevant(const TreeIndex& t1,
    const TreeIndex& t2,const int x, const int y, const int k) const {
  // The lower bound formula (RA + D + L):
  // |(|T1|-(x+1))-(|T2|-(y+1))| + ||T1_x|-|T2_y|| + |((x+1)-|T1_x|)-((y+1)-|T2_y|)| < k
  // New lower bound formula (R + A + D + L):
  // |(|T1|-(x+1)-depth(x))-(|T2|-(y+1)-depth(y))| + |depth(x)-depth(y)| + ||T1_x|-|T2_y|| + |((x+1)-|T1_x|)-((y+1)-|T2_y|)| < k
  int x_size = t1.postl_to_size_[x];
  int y_size = t2.postl_to_size_[y];
  // int lower_bound = std::abs((t1_size_.back() - (x+1)) - (t2_size_.back() - (y+1))) +
  //                   std::abs(x_size - y_size) +
  //                   std::abs(((x+1) - x_size) - ((y+1) - y_size));

  int lower_bound = std::abs((t1.tree_size_ - (x+1) - t1.postl_to_depth_[x]) - (t2.tree_size_ - (y+1) - t2.postl_to_depth_[y])) +
                    std::abs(t1.postl_to_depth_[x] - t2.postl_to_depth_[y]) +
                    std::abs(x_size - y_size) +
                    std::abs(((x+1) - x_size) - ((y+1) - y_size));

  // NOTE: The pair (x,y) is k-relevant if lower_bound <= k.
  //       lower_bound < k is not correct because then (x,y) would be
  //       k-irrelevant for lower_bound = k. That would further mean that the
  //       subtrees T1_x and T2_y cannot be mapped with the given budget.
  if (lower_bound <= k) {
    return true;
  }
  return false;
}